

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

jx9_value * jx9_new_array(jx9_vm *pVm)

{
  jx9_hashmap *pMap;
  jx9_value *pSrc;
  _func_sxu32_void_ptr_sxu32 *in_RDX;
  _func_sxu32_sxi64 *in_RSI;
  
  if (((pVm != (jx9_vm *)0x0) && (pVm->nMagic != 0xdead2bad)) &&
     (pMap = jx9NewHashmap(pVm,in_RSI,in_RDX), pMap != (jx9_hashmap *)0x0)) {
    pSrc = (jx9_value *)SyMemBackendPoolAlloc(&pVm->sAllocator,0x40);
    if (pSrc != (jx9_value *)0x0) {
      SyZero(pSrc,0x40);
      pSrc->pVm = pVm;
      (pSrc->sBlob).pBlob = (void *)0x0;
      (pSrc->sBlob).nByte = 0;
      (pSrc->sBlob).mByte = 0;
      (pSrc->sBlob).pAllocator = &pVm->sAllocator;
      (pSrc->sBlob).nFlags = 0;
      pSrc->iFlags = 0x40;
      (pSrc->x).pOther = pMap;
      return pSrc;
    }
    jx9HashmapRelease(pMap,1);
  }
  return (jx9_value *)0x0;
}

Assistant:

JX9_PRIVATE jx9_value * jx9_new_array(jx9_vm *pVm)
{
	jx9_hashmap *pMap;
	jx9_value *pObj;
	/* Ticket 1433-002: NULL VM is harmless operation */
	if ( JX9_VM_MISUSE(pVm) ){
		return 0;
	}
	/* Create a new hashmap first */
	pMap = jx9NewHashmap(&(*pVm), 0, 0);
	if( pMap == 0 ){
		return 0;
	}
	/* Associate a new jx9_value with this hashmap */
	pObj = (jx9_value *)SyMemBackendPoolAlloc(&pVm->sAllocator, sizeof(jx9_value));
	if( pObj == 0 ){
		jx9HashmapRelease(pMap, TRUE);
		return 0;
	}
	jx9MemObjInitFromArray(pVm, pObj, pMap);
	return pObj;
}